

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.h
# Opt level: O2

void __thiscall HighsDomain::setupObjectivePropagation(HighsDomain *this)

{
  ObjectivePropagation local_b0;
  
  ObjectivePropagation::ObjectivePropagation(&local_b0,this);
  ObjectivePropagation::operator=(&this->objProp_,&local_b0);
  ObjectivePropagation::~ObjectivePropagation(&local_b0);
  return;
}

Assistant:

void setupObjectivePropagation() { objProp_ = ObjectivePropagation(this); }